

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"[x: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->x);
  poVar1 = std::operator<<(poVar1," y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->y);
  poVar1 = std::operator<<(poVar1," width: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->width);
  poVar1 = std::operator<<(poVar1," height: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->height);
  std::operator<<(poVar1,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Rectangle3& rectangle)
    {
        os << "[x: " << rectangle.x << " y: " << rectangle.y
           << " width: " << rectangle.width << " height: " << rectangle.height << "]";
        return os;
    }